

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewEnd(LocationUpdater *this,BinaryLocation oldEnd)

{
  bool bVar1;
  BinaryLocation oldEnd_local;
  LocationUpdater *this_local;
  
  bVar1 = hasOldExprEnd(this,oldEnd);
  if (bVar1) {
    this_local._4_4_ = getNewExprEnd(this,oldEnd);
  }
  else {
    bVar1 = hasOldFuncEnd(this,oldEnd);
    if (bVar1) {
      this_local._4_4_ = getNewFuncEnd(this,oldEnd);
    }
    else {
      bVar1 = hasOldDelimiter(this,oldEnd);
      if (bVar1) {
        this_local._4_4_ = getNewDelimiter(this,oldEnd);
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BinaryLocation getNewEnd(BinaryLocation oldEnd) const {
    if (hasOldExprEnd(oldEnd)) {
      return getNewExprEnd(oldEnd);
    } else if (hasOldFuncEnd(oldEnd)) {
      return getNewFuncEnd(oldEnd);
    } else if (hasOldDelimiter(oldEnd)) {
      return getNewDelimiter(oldEnd);
    }
    return 0;
  }